

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  tile_details *ptVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  ulong uVar7;
  uint16 uVar8;
  uint a;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar9;
  
  uVar11 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar7 = (ulong)(this->m_tiles).m_size;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar7 * data;
  uVar11 = ((data + 1) * uVar7) / uVar11;
  if (SUB164(auVar5 / auVar4,0) < (uint)uVar11) {
    uVar7 = SUB168(auVar5 / auVar4,0) & 0xffffffff;
    do {
      if (((this->m_tiles).m_p[uVar7].pixels.m_size != 0) && (this->m_num_alpha_blocks != 0)) {
        uVar10 = 0;
        do {
          ptVar3 = (this->m_tiles).m_p;
          uVar9 = 0;
          uVar8 = 0;
          if ((ulong)*(uint *)((long)pData_ptr + 0xa0) != 0) {
            uVar1 = *(undefined8 *)ptVar3[uVar7].alpha_endpoints[uVar10].m_s;
            uVar12 = 0;
            fVar13 = 1e+37;
            do {
              uVar2 = *(undefined8 *)(*(long *)((long)pData_ptr + 0x98) + uVar12 * 8);
              fVar14 = (float)uVar2 - (float)uVar1;
              fVar15 = (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
              fVar14 = fVar15 * fVar15 + fVar14 * fVar14;
              bVar6 = true;
              if (fVar14 < fVar13) {
                if ((fVar14 == 0.0) && (!NAN(fVar14))) {
                  bVar6 = false;
                }
                uVar9 = uVar12 & 0xffffffff;
                fVar13 = fVar14;
              }
              uVar8 = (uint16)uVar9;
            } while ((bVar6) && (uVar12 = uVar12 + 1, uVar12 < *(uint *)((long)pData_ptr + 0xa0)));
          }
          ptVar3[uVar7].cluster_indices[uVar10 + 1] = uVar8;
          uVar10 = uVar10 + 1;
        } while (uVar10 < this->m_num_alpha_blocks);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (uVar11 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_clusters_task(uint64 data, void* pData_ptr) {
  tree_clusterizer<vec2F>* vq = (tree_clusterizer<vec2F>*)pData_ptr;
  const crnlib::vector<vec2F>& codebook = vq->get_codebook();
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++) {
    if (m_tiles[t].pixels.size()) {
      for (uint a = 0; a < m_num_alpha_blocks; a++) {
        const vec2F& v = m_tiles[t].alpha_endpoints[a];
        float best_dist = math::cNearlyInfinite;
        uint best_index = 0;
        for (uint i = 0; i < codebook.size(); i++) {
          float dist = (codebook[i][0] - v[0]) * (codebook[i][0] - v[0]) + (codebook[i][1] - v[1]) * (codebook[i][1] - v[1]);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = i;
            if (best_dist == 0.0f)
              break;
          }
        }
        m_tiles[t].cluster_indices[cAlpha0 + a] = best_index;
      }
    }
  }
}